

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O2

void __thiscall FIX::SessionState::logoutReason(SessionState *this,string *value)

{
  Mutex::lock(&this->m_mutex);
  std::__cxx11::string::_M_assign((string *)&this->m_logoutReason);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void logoutReason(const std::string &value) {
    Locker l(m_mutex);
    m_logoutReason = value;
  }